

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O2

void __thiscall
absl::lts_20250127::synchronization_internal::GraphCycles::GraphCycles(GraphCycles *this)

{
  Rep *this_00;
  
  base_internal::SpinLock::Lock
            ((SpinLock *)&synchronization_internal::(anonymous_namespace)::arena_mu);
  if (synchronization_internal::(anonymous_namespace)::arena == (Arena *)0x0) {
    synchronization_internal::(anonymous_namespace)::arena =
         base_internal::LowLevelAlloc::NewArena(0);
  }
  base_internal::SpinLock::Unlock
            ((SpinLock *)&synchronization_internal::(anonymous_namespace)::arena_mu);
  this_00 = (Rep *)base_internal::LowLevelAlloc::AllocWithArena
                             (0x100168,synchronization_internal::(anonymous_namespace)::arena);
  Rep::Rep(this_00);
  this->rep_ = this_00;
  return;
}

Assistant:

GraphCycles::GraphCycles() {
  InitArenaIfNecessary();
  rep_ = new (base_internal::LowLevelAlloc::AllocWithArena(sizeof(Rep), arena))
      Rep;
}